

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_bounded_q.h
# Opt level: O1

void __thiscall
spdlog::details::mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg>::
mpmc_bounded_queue(mpmc_bounded_queue<spdlog::details::async_log_helper::async_msg> *this,
                  size_t buffer_size)

{
  undefined1 auVar1 [16];
  size_t *psVar2;
  size_t *psVar3;
  ulong uVar4;
  undefined8 *puVar5;
  size_t i;
  size_t sVar6;
  long lVar7;
  uint *local_38;
  undefined8 local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = buffer_size;
  this->max_size_ = buffer_size;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x70),8) == 0) {
    uVar4 = SUB168(auVar1 * ZEXT816(0x70),0) | 8;
  }
  psVar2 = (size_t *)operator_new__(uVar4);
  *psVar2 = buffer_size;
  if (buffer_size != 0) {
    psVar3 = psVar2 + 0xb;
    lVar7 = buffer_size * 0x70;
    do {
      psVar3[-9] = (size_t)(psVar3 + -7);
      psVar3[-8] = 0;
      *(undefined1 *)(psVar3 + -7) = 0;
      psVar3[-4] = 0;
      psVar3[-2] = (size_t)psVar3;
      psVar3[-1] = 0;
      *(undefined1 *)psVar3 = 0;
      psVar3 = psVar3 + 0xe;
      lVar7 = lVar7 + -0x70;
    } while (lVar7 != 0);
  }
  this->buffer_ = (cell_t *)(psVar2 + 1);
  this->buffer_mask_ = buffer_size - 1;
  if ((1 < buffer_size) &&
     (uVar4 = buffer_size - (buffer_size >> 1 & 0x5555555555555555),
     uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333),
     (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 2)) {
    lVar7 = 0;
    sVar6 = 0;
    do {
      *(size_t *)((long)&(this->buffer_->sequence_).super___atomic_base<unsigned_long>._M_i + lVar7)
           = sVar6;
      sVar6 = sVar6 + 1;
      lVar7 = lVar7 + 0x70;
    } while (buffer_size != sVar6);
    (this->enqueue_pos_).super___atomic_base<unsigned_long>._M_i = 0;
    (this->dequeue_pos_).super___atomic_base<unsigned_long>._M_i = 0;
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"async logger queue size must be power of two","");
  *puVar5 = &PTR__spdlog_ex_00126e00;
  puVar5[1] = puVar5 + 3;
  if (local_38 == &local_28) {
    *(uint *)(puVar5 + 3) = local_28;
    *(undefined4 *)((long)puVar5 + 0x1c) = uStack_24;
    *(undefined4 *)(puVar5 + 4) = uStack_20;
    *(undefined4 *)((long)puVar5 + 0x24) = uStack_1c;
  }
  else {
    puVar5[1] = local_38;
    puVar5[3] = CONCAT44(uStack_24,local_28);
  }
  puVar5[2] = local_30;
  local_30 = 0;
  local_28 = local_28 & 0xffffff00;
  local_38 = &local_28;
  __cxa_throw(puVar5,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

explicit mpmc_bounded_queue(size_t buffer_size)
        : max_size_(buffer_size)
        , buffer_(new cell_t[buffer_size])
        , buffer_mask_(buffer_size - 1)
    {
        // queue size must be power of two
        if (!((buffer_size >= 2) && ((buffer_size & (buffer_size - 1)) == 0)))
        {
            throw spdlog_ex("async logger queue size must be power of two");
        }

        for (size_t i = 0; i != buffer_size; i += 1)
        {
            buffer_[i].sequence_.store(i, std::memory_order_relaxed);
        }
        enqueue_pos_.store(0, std::memory_order_relaxed);
        dequeue_pos_.store(0, std::memory_order_relaxed);
    }